

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_unittest.cc
# Opt level: O0

void __thiscall bssl::der::test::InputTest_LessThan_Test::TestBody(InputTest_LessThan_Test *this)

{
  Input rhs;
  Input lhs;
  Input rhs_00;
  Input lhs_00;
  Input rhs_01;
  Input lhs_01;
  Input rhs_02;
  Input lhs_02;
  Input rhs_03;
  Input lhs_03;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_R9;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  uchar *local_268;
  uchar *puStack_260;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  uchar *puStack_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_208;
  Message local_200;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  uchar *puStack_1f0;
  uchar *local_1e8;
  uchar *puStack_1e0;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  Input test_truncated;
  AssertHelper local_188;
  Message local_180;
  uchar *local_178;
  uchar *puStack_170;
  uchar *local_168;
  uchar *puStack_160;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_118;
  Message local_110;
  uchar *local_108;
  uchar *puStack_100;
  uchar *local_f8;
  uchar *puStack_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  undefined1 auStack_b8 [8];
  Input test2;
  AssertHelper local_88;
  Message local_80 [3];
  uchar *local_68;
  uchar *puStack_60;
  uchar *local_58;
  uchar *puStack_50;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  undefined1 auStack_20 [8];
  Input test;
  InputTest_LessThan_Test *this_local;
  
  test.data_.size_ = (size_t)this;
  Span<unsigned_char_const>::Span<4ul>
            ((Span<unsigned_char_const> *)&gtest_ar_.message_,(uchar (*) [4])&kInput);
  Input::Input((Input *)auStack_20,stack0xffffffffffffffd0);
  local_58 = (uchar *)auStack_20;
  puStack_50 = test.data_.data_;
  local_68 = (uchar *)auStack_20;
  puStack_60 = test.data_.data_;
  lhs_03.data_.size_ = (size_t)test.data_.data_;
  lhs_03.data_.data_ = (uchar *)auStack_20;
  rhs_03.data_.size_ = (size_t)test.data_.data_;
  rhs_03.data_.data_ = (uchar *)auStack_20;
  local_41 = operator<(lhs_03,rhs_03);
  local_41 = !local_41;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&test2.data_.size_,(internal *)local_40,(AssertionResult *)"test < test",
               "true","false",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    ::std::__cxx11::string::~string((string *)&test2.data_.size_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  Span<unsigned_char_const>::Span<4ul>
            ((Span<unsigned_char_const> *)&gtest_ar__1.message_,(uchar (*) [4])&kInput2);
  Input::Input((Input *)auStack_b8,stack0xffffffffffffff38);
  local_f8 = (uchar *)auStack_20;
  puStack_f0 = test.data_.data_;
  local_108 = (uchar *)auStack_b8;
  puStack_100 = test2.data_.data_;
  lhs_02.data_.size_ = (size_t)test.data_.data_;
  lhs_02.data_.data_ = (uchar *)auStack_20;
  rhs_02.data_.size_ = (size_t)test2.data_.data_;
  rhs_02.data_.data_ = (uchar *)auStack_b8;
  local_d9 = operator<(lhs_02,rhs_02);
  local_d9 = !local_d9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_d8,
               (AssertionResult *)"test < test2","true","false",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    ::std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_168 = (uchar *)auStack_b8;
  puStack_160 = test2.data_.data_;
  local_178 = (uchar *)auStack_20;
  puStack_170 = test.data_.data_;
  lhs_01.data_.size_ = (size_t)test2.data_.data_;
  lhs_01.data_.data_ = (uchar *)auStack_b8;
  rhs_01.data_.size_ = (size_t)test.data_.data_;
  rhs_01.data_.data_ = (uchar *)auStack_20;
  local_149 = operator<(lhs_01,rhs_01);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&test_truncated.data_.size_,(internal *)local_148,
               (AssertionResult *)"test2 < test","false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    ::std::__cxx11::string::~string((string *)&test_truncated.data_.size_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  sVar3 = ::std::size<unsigned_char,4ul>((uchar (*) [4])&kInput);
  Input::Input((Input *)&gtest_ar__3.message_,"testtealN4bssl3der4test21InputTest_Equals_TestE",
               sVar3 - 1);
  local_1e8 = (uchar *)auStack_20;
  puStack_1e0 = test.data_.data_;
  local_1f8.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  puStack_1f0 = test_truncated.data_.data_;
  lhs_00.data_.size_ = (size_t)test.data_.data_;
  lhs_00.data_.data_ = (uchar *)auStack_20;
  rhs_00.data_.size_ = (size_t)test_truncated.data_.data_;
  rhs_00.data_.data_ =
       (uchar *)gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  local_1c9 = operator<(lhs_00,rhs_00);
  local_1c9 = !local_1c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1c8,
               (AssertionResult *)"test < test_truncated","true","false",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    ::std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_258.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  puStack_250 = test_truncated.data_.data_;
  local_268 = (uchar *)auStack_20;
  puStack_260 = test.data_.data_;
  lhs.data_.size_ = (size_t)test_truncated.data_.data_;
  lhs.data_.data_ =
       (uchar *)gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  rhs.data_.size_ = (size_t)test.data_.data_;
  rhs.data_.data_ = (uchar *)auStack_20;
  local_239 = operator<(lhs,rhs);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_298,(internal *)local_238,(AssertionResult *)"test_truncated < test","false",
               "true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    ::std::__cxx11::string::~string((string *)&local_298);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  return;
}

Assistant:

TEST(InputTest, LessThan) {
  Input test(kInput);
  EXPECT_FALSE(test < test);

  Input test2(kInput2);
  EXPECT_FALSE(test < test2);
  EXPECT_TRUE(test2 < test);

  Input test_truncated(kInput, std::size(kInput) - 1);
  EXPECT_FALSE(test < test_truncated);
  EXPECT_TRUE(test_truncated < test);
}